

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

Am_Point_List * __thiscall Am_Point_List::operator=(Am_Point_List *this,Am_Point_List *prev)

{
  Am_Point_List *prev_local;
  Am_Point_List *this_local;
  
  if (this->data != (Am_Point_List_Data *)0x0) {
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  this->data = prev->data;
  this->item = prev->item;
  if (this->data != (Am_Point_List_Data *)0x0) {
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::operator=(const Am_Point_List &prev)
{
  if (data)
    data->Release();
  data = prev.data;
  item = prev.item;
  if (data)
    data->Note_Reference();
  return *this;
}